

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O3

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Enum args_2)

{
  Type *pTVar1;
  TypeVector local_48;
  
  if (result.enum_ == Error) {
    if (args_2 == Reference) {
      __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x43,"wabt::Type::Type(Enum)");
    }
    pTVar1 = (Type *)operator_new(0x18);
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1 + 3;
    *pTVar1 = args;
    pTVar1[1] = args_1;
    pTVar1[2].enum_ = args_2;
    pTVar1[2].type_index_ = 0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = pTVar1;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    PrintStackIfFailedV(this,(Result)0x1,desc,&local_48,false);
    operator_delete(pTVar1,0x18);
  }
  return;
}

Assistant:

void set_error_callback(const ErrorCallback& error_callback) {
    error_callback_ = error_callback;
  }